

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcptran_pipe_send_start(tcptran_pipe *p)

{
  nni_aio *pnVar1;
  nni_msg *m;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  uint64_t len;
  nni_iov iov [3];
  uint local_2c;
  int niov;
  nni_msg *msg;
  nni_aio *txaio;
  nni_aio *aio;
  tcptran_pipe *p_local;
  
  if ((p->closed & 1U) == 0) {
    pnVar1 = (nni_aio *)nni_list_first(&p->sendq);
    if (pnVar1 != (nni_aio *)0x0) {
      m = nni_aio_get_msg(pnVar1);
      sVar2 = nni_msg_len(m);
      sVar3 = nni_msg_header_len(m);
      lVar4 = sVar2 + sVar3;
      p->txlen[0] = (uint8_t)((ulong)lVar4 >> 0x38);
      p->txlen[1] = (uint8_t)((ulong)lVar4 >> 0x30);
      p->txlen[2] = (uint8_t)((ulong)lVar4 >> 0x28);
      p->txlen[3] = (uint8_t)((ulong)lVar4 >> 0x20);
      p->txlen[4] = (uint8_t)((ulong)lVar4 >> 0x18);
      p->txlen[5] = (uint8_t)((ulong)lVar4 >> 0x10);
      p->txlen[6] = (uint8_t)((ulong)lVar4 >> 8);
      p->txlen[7] = (uint8_t)lVar4;
      len = (uint64_t)p->txlen;
      iov[0].iov_buf = (void *)0x8;
      local_2c = 1;
      sVar2 = nni_msg_header_len(m);
      if (sVar2 != 0) {
        iov[0].iov_len = (size_t)nni_msg_header(m);
        iov[1].iov_buf = (void *)nni_msg_header_len(m);
        local_2c = 2;
      }
      sVar2 = nni_msg_len(m);
      if (sVar2 != 0) {
        pvVar5 = nni_msg_body(m);
        iov[(long)(int)local_2c + -1].iov_len = (size_t)pvVar5;
        pvVar5 = (void *)nni_msg_len(m);
        iov[(int)local_2c].iov_buf = pvVar5;
        local_2c = local_2c + 1;
      }
      nni_aio_set_iov(&p->txaio,local_2c,(nni_iov *)&len);
      nng_stream_send(p->conn,&p->txaio);
    }
  }
  else {
    while (pnVar1 = (nni_aio *)nni_list_first(&p->sendq), pnVar1 != (nni_aio *)0x0) {
      nni_list_remove(&p->sendq,pnVar1);
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
  }
  return;
}

Assistant:

static void
tcptran_pipe_send_start(tcptran_pipe *p)
{
	nni_aio *aio;
	nni_aio *txaio;
	nni_msg *msg;
	int      niov;
	nni_iov  iov[3];
	uint64_t len;

	if (p->closed) {
		while ((aio = nni_list_first(&p->sendq)) != NULL) {
			nni_list_remove(&p->sendq, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}

	if ((aio = nni_list_first(&p->sendq)) == NULL) {
		return;
	}

	// This runs to send the message.
	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg) + nni_msg_header_len(msg);

	NNI_PUT64(p->txlen, len);

	txaio          = &p->txaio;
	niov           = 0;
	iov[0].iov_buf = p->txlen;
	iov[0].iov_len = sizeof(p->txlen);
	niov++;
	if (nni_msg_header_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_header(msg);
		iov[niov].iov_len = nni_msg_header_len(msg);
		niov++;
	}
	if (nni_msg_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_body(msg);
		iov[niov].iov_len = nni_msg_len(msg);
		niov++;
	}
	nni_aio_set_iov(txaio, niov, iov);
	nng_stream_send(p->conn, txaio);
}